

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c-writer.cc
# Opt level: O0

size_t __thiscall wabt::anon_unknown_0::CWriter::BeginTry(CWriter *this,Block *block)

{
  size_t sVar1;
  __type _Var2;
  Index IVar3;
  reference pvVar4;
  reference pvVar5;
  Newline local_9d;
  OpenBrace local_9c [2];
  Newline local_9a;
  Newline local_99;
  size_t local_98;
  size_t mark;
  string_view local_88;
  undefined1 local_78 [8];
  string tlabel;
  allocator<char> local_39;
  value_type local_38;
  Block *local_18;
  Block *block_local;
  CWriter *this_local;
  
  local_18 = block;
  block_local = (Block *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"exceptions",&local_39);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::insert(&this->func_includes_,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator(&local_39);
  Write(this);
  local_88 = (string_view)
             std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_18);
  (anonymous_namespace)::CWriter::DefineLabelName_abi_cxx11_
            ((string *)local_78,(CWriter *)this,local_88);
  (anonymous_namespace)::CWriter::
  Write<char_const(&)[24],std::__cxx11::string_const&,char_const(&)[45],wabt::(anonymous_namespace)::Newline>
            ((CWriter *)this,(char (*) [24])"WASM_RT_UNWIND_TARGET *",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78,
             (char (*) [45])"_outer_target = wasm_rt_get_unwind_target();",
             (Newline *)((long)&mark + 7));
  (anonymous_namespace)::CWriter::
  Write<char_const(&)[23],std::__cxx11::string_const&,char_const(&)[16],wabt::(anonymous_namespace)::Newline>
            ((CWriter *)this,(char (*) [23])"WASM_RT_UNWIND_TARGET ",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78,
             (char (*) [16])"_unwind_target;",(Newline *)((long)&mark + 6));
  (anonymous_namespace)::CWriter::
  Write<char_const(&)[18],std::__cxx11::string_const&,char_const(&)[18]>
            ((CWriter *)this,(char (*) [18])"if (!wasm_rt_try(",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78,
             (char (*) [18])"_unwind_target)) ");
  Write(this);
  IVar3 = FuncDeclaration::GetNumParams(&local_18->decl);
  DropTypes(this,(ulong)IVar3);
  local_98 = MarkTypeStack(this);
  PushLabel(this,Try,&local_18->label,&(local_18->decl).sig,false);
  PushTypes(this,&(local_18->decl).sig.param_types);
  (anonymous_namespace)::CWriter::
  Write<char_const(&)[28],std::__cxx11::string_const&,char_const(&)[17],wabt::(anonymous_namespace)::Newline>
            ((CWriter *)this,(char (*) [28])"wasm_rt_set_unwind_target(&",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78,
             (char (*) [17])"_unwind_target);",&local_99);
  PushTryCatch(this,(string *)local_78);
  Write(this,&local_18->exprs);
  ResetTypeStack(this,local_98);
  (anonymous_namespace)::CWriter::
  Write<char_const(&)[27],std::__cxx11::string_const&,char_const(&)[16],wabt::(anonymous_namespace)::Newline>
            ((CWriter *)this,(char (*) [27])"wasm_rt_set_unwind_target(",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78,
             (char (*) [16])"_outer_target);",&local_9a);
  Write(this);
  (anonymous_namespace)::CWriter::Write<char_const(&)[7],wabt::(anonymous_namespace)::OpenBrace>
            ((CWriter *)this,(char (*) [7])" else ",local_9c);
  pvVar4 = std::
           vector<wabt::(anonymous_namespace)::Label,_std::allocator<wabt::(anonymous_namespace)::Label>_>
           ::back(&this->label_stack_);
  _Var2 = std::operator==(pvVar4->name,&local_18->label);
  if (!_Var2) {
    __assert_fail("label_stack_.back().name == block.label",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/c-writer.cc"
                  ,0xd0e,"size_t wabt::(anonymous namespace)::CWriter::BeginTry(const Block &)");
  }
  pvVar4 = std::
           vector<wabt::(anonymous_namespace)::Label,_std::allocator<wabt::(anonymous_namespace)::Label>_>
           ::back(&this->label_stack_);
  if (pvVar4->label_type == Try) {
    pvVar4 = std::
             vector<wabt::(anonymous_namespace)::Label,_std::allocator<wabt::(anonymous_namespace)::Label>_>
             ::back(&this->label_stack_);
    pvVar4->label_type = Catch;
    pvVar5 = std::
             vector<wabt::(anonymous_namespace)::TryCatchLabel,_std::allocator<wabt::(anonymous_namespace)::TryCatchLabel>_>
             ::back(&this->try_catch_stack_);
    if ((pvVar5->used & 1U) != 0) {
      (anonymous_namespace)::CWriter::
      Write<std::__cxx11::string_const&,char_const(&)[9],wabt::(anonymous_namespace)::Newline>
                ((CWriter *)this,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78,
                 (char (*) [9])"_catch:;",&local_9d);
    }
    sVar1 = local_98;
    std::__cxx11::string::~string((string *)local_78);
    return sVar1;
  }
  __assert_fail("label_stack_.back().label_type == LabelType::Try",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/c-writer.cc"
                ,0xd0f,"size_t wabt::(anonymous namespace)::CWriter::BeginTry(const Block &)");
}

Assistant:

size_t CWriter::BeginTry(const Block& block) {
  func_includes_.insert("exceptions");
  Write(OpenBrace()); /* beginning of try-catch or try_table */
  const std::string tlabel = DefineLabelName(block.label);
  Write("WASM_RT_UNWIND_TARGET *", tlabel,
        "_outer_target = wasm_rt_get_unwind_target();", Newline());
  Write("WASM_RT_UNWIND_TARGET ", tlabel, "_unwind_target;", Newline());
  Write("if (!wasm_rt_try(", tlabel, "_unwind_target)) ");
  Write(OpenBrace()); /* beginning of try or try_table block */
  DropTypes(block.decl.GetNumParams());
  const size_t mark = MarkTypeStack();
  PushLabel(LabelType::Try, block.label, block.decl.sig);
  PushTypes(block.decl.sig.param_types);
  Write("wasm_rt_set_unwind_target(&", tlabel, "_unwind_target);", Newline());
  PushTryCatch(tlabel);
  Write(block.exprs);
  ResetTypeStack(mark);
  Write("wasm_rt_set_unwind_target(", tlabel, "_outer_target);", Newline());
  Write(CloseBrace());          /* end of try or try_table block */
  Write(" else ", OpenBrace()); /* beginning of catch blocks or delegate */
  assert(label_stack_.back().name == block.label);
  assert(label_stack_.back().label_type == LabelType::Try);
  label_stack_.back().label_type = LabelType::Catch;
  if (try_catch_stack_.back().used) {
    Write(tlabel, "_catch:;", Newline());
  }

  return mark;
}